

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O3

void __thiscall HighFreqDataType::print(HighFreqDataType *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-Printing HighFreqDataType:\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  name: ",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n  origin: ",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->origin)._M_dataplus._M_p,(this->origin)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n  dataFormat: ",0xf);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->dataFormat)._M_dataplus._M_p,(this->dataFormat)._M_string_length
                     );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  SockAddress: ",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(this->sockAddr)._M_dataplus._M_p,
             (this->sockAddr)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  return;
}

Assistant:

void HighFreqDataType::print() {
    std::cout << "-Printing HighFreqDataType:\n";
    std::cout << "  name: " << name << "\n  origin: " << origin << "\n  dataFormat: " << dataFormat << std::endl;
    std::cout << "  SockAddress: " << sockAddr;
    std::cout << std::endl;
}